

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dieharder_file.cc
# Opt level: O0

bool try_parse<unsigned_long>(char *str,unsigned_long *res)

{
  byte bVar1;
  ulong *in_RSI;
  char *in_RDI;
  stringstream stream;
  byte local_1a6;
  stringstream local_198 [16];
  ostream local_188 [376];
  ulong *local_10;
  char *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::__cxx11::stringstream::stringstream(local_198);
  std::operator<<(local_188,local_8);
  *local_10 = 0;
  std::istream::operator>>((istream *)local_198,local_10);
  bVar1 = std::ios::eof();
  local_1a6 = 0;
  if ((bVar1 & 1) != 0) {
    local_1a6 = std::ios::fail();
    local_1a6 = local_1a6 ^ 0xff;
  }
  std::__cxx11::stringstream::~stringstream(local_198);
  return (bool)(local_1a6 & 1);
}

Assistant:

bool try_parse(const char *const str, T &res) {
  std::stringstream stream;
  stream << str;
  res = T{};
  stream >> res;
  return stream.eof() and not stream.fail();
}